

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe7At0(uint8_t *buf)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = *buf & 0x7f;
  uVar1 = (ulong)uVar2 - 0x80;
  if ((byte)uVar2 < 0x40) {
    uVar1 = (ulong)uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe7At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res &= UINT64_C(0x7f);

    if (res >> 6) {
        res |= UINT64_C(0xffffffffffffff80);
    }

    return static_cast<std::int64_t>(res);
}